

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal
          (ChElementBeamEuler *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChMatrix33<double> *pCVar1;
  long lVar2;
  double *pdVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  DstXprType *pDVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  double dVar14;
  undefined1 auVar15 [16];
  bool bVar16;
  ChMatrixConstRef pRVar17;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  gVar18;
  int iVar19;
  Index dstCols;
  pointer psVar20;
  element_type *peVar21;
  pointer ppCVar22;
  undefined8 *puVar23;
  Index index;
  ulong uVar24;
  double *pdVar25;
  PointerType pdVar26;
  char *pcVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  long lVar32;
  long lVar33;
  int i_1;
  element_type *peVar34;
  long lVar35;
  int i;
  ChElementBeamEuler *pCVar36;
  int i_3;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar47;
  undefined1 auVar53 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  double extraout_XMM0_Qb;
  undefined1 auVar57 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  DstXprType *pDVar70;
  undefined1 auVar71 [16];
  assign_op<double,_double> *paVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  DstEvaluatorType *pDVar76;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  variable_if_dynamic<long,__1> vVar87;
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  ChVectorDynamic<> FiD;
  ChVectorDynamic<> Fi0;
  ActualDstType actualDst;
  ChMatrixDynamic<> CKCt;
  ChVector<double> wb0;
  ChMatrixDynamic<> H_num;
  ChVector<double> wa0;
  ChVectorDynamic<> displ;
  ChQuaternion<double> q;
  DstEvaluatorType dstEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> Atoabs;
  assign_op<double,_double> local_651;
  DstXprType *local_650;
  ChMatrix33<double> **ppCStack_648;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_640;
  ChElementBeamEuler *local_620;
  ChMatrixConstRef local_618;
  undefined1 local_610 [16];
  DstXprType *local_5f8;
  DenseStorage<double,__1,__1,__1,_1> local_5f0;
  variable_if_dynamic<long,__1> local_5d0;
  double dStack_5c8;
  DenseStorage<double,__1,__1,__1,_1> local_5c0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_5a0;
  ChMatrix33<double> local_580;
  DstXprType *local_530;
  undefined8 uStack_528;
  DenseStorage<double,__1,__1,__1,_1> local_520;
  undefined1 local_500 [16];
  double dStack_4f0;
  double dStack_4e8;
  DstXprType local_4d0;
  double dStack_488;
  undefined1 local_480 [24];
  DstXprType DStack_468;
  double local_420;
  double dStack_418;
  double dStack_410;
  double dStack_408;
  double local_400;
  double dStack_3f8;
  double dStack_3f0;
  double dStack_3e8;
  double local_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double dStack_3c8;
  double local_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double local_3a0;
  double dStack_398;
  double dStack_390;
  double dStack_388;
  double local_380;
  double dStack_378;
  double dStack_370;
  double dStack_368;
  ChMatrix33<double> local_350;
  double local_308;
  double local_300;
  double dStack_2f8;
  double dStack_2f0;
  double adStack_2e8 [2];
  undefined1 local_2d8 [16];
  variable_if_dynamic<long,__1> local_2c8;
  DstXprType *local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  ChMatrix33<double> *local_2a0;
  SrcEvaluatorType *local_298;
  double adStack_290 [2];
  undefined1 local_280 [32];
  scalar_constant_op<double> sStack_260;
  plainobjectbase_evaluator_data<double,_0> pStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double dStack_230;
  double dStack_228;
  double dStack_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  double local_200;
  double dStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double dStack_1e0;
  double dStack_1d8;
  double dStack_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double dStack_198;
  double dStack_190;
  double dStack_188;
  double dStack_180;
  double dStack_178;
  double dStack_170;
  double dStack_168;
  double local_130;
  double local_118;
  ChMatrixRef local_110;
  ChMatrixRef local_e8;
  ChMatrix33<double> local_c0 [2];
  
  local_5f8 = (DstXprType *)Rfactor;
  local_308 = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0xc) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0xc)) {
    __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x1d2,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_530 = (DstXprType *)Kfactor;
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x1d3,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_620 = this;
  local_618 = (ChMatrixConstRef)H;
  if ((((Kfactor == 0.0) && (!NAN(Kfactor))) && (Rfactor == 0.0)) && (!NAN(Rfactor))) {
    local_2d8._0_8_ = (ChMatrix33<double> *)0x0;
    local_280._0_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_280._16_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_480._8_8_ = local_2d8;
    local_480._0_8_ = local_280;
    local_480._16_8_ = &local_4d0;
    DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_480);
    pCVar36 = this;
LAB_00660aea:
    if (((local_308 != 0.0) || (NAN(local_308))) ||
       ((((double)local_5f8 != 0.0 || (NAN((double)local_5f8))) &&
        ((dVar47 = ((pCVar36->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rdamping_alpha, dVar47 != 0.0 || (NAN(dVar47))))))) {
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)&local_350,0x90,0xc,0xc);
      gVar18 = _local_480;
      local_480._8_8_ =
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_480._0_8_ =
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)gVar18.m_dstExpr;
      local_480._16_8_ = 0;
      if ((long)((ulong)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] |
                (ulong)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1]) < 0) {
        pcVar27 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
        ;
        goto LAB_006610aa;
      }
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_350,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)local_480,(assign_op<double,_double> *)local_280);
      peVar34 = (pCVar36->section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*(peVar34->super_ChBeamSection)._vptr_ChBeamSection[0xd])(peVar34,local_480);
      if ((pCVar36->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pCVar36->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auVar63._8_8_ = 0;
        auVar63._0_8_ = local_308;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = local_5f8;
        lVar30 = 0x18;
        lVar35 = 0;
        uVar39 = 0;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = ((pCVar36->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->rdamping_alpha;
        auVar97 = vfmadd231sd_fma(auVar63,auVar72,auVar9);
        local_5d0.m_value = (long)((pCVar36->super_ChElementBeam).length * 0.5 * auVar97._0_8_);
        local_300 = (double)local_5d0.m_value;
        dStack_2f8 = 0.0;
        dStack_5c8 = (double)local_5d0.m_value;
        do {
          lVar32 = uVar39 * 6 + 3;
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar32) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar32)) {
LAB_006610ea:
            pcVar27 = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
            ;
            goto LAB_006610ff;
          }
          pdVar25 = (double *)
                    ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[0] +
                    (long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array[2] + 1U) * lVar35 + 0x10);
          lVar28 = 0x10;
          do {
            dVar47 = *(double *)((long)&dStack_488 + lVar28);
            pdVar25[0xfffffffffffffffe] =
                 (double)local_5d0.m_value *
                 *(double *)
                  ((long)local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar28 + 0x40) + pdVar25[0xfffffffffffffffe];
            pdVar25[0xffffffffffffffff] = dStack_5c8 * dVar47 + pdVar25[0xffffffffffffffff];
            pdVar3 = (double *)(local_480 + lVar28);
            lVar28 = lVar28 + 0x30;
            *pdVar25 = local_300 * *pdVar3 + *pdVar25;
            pdVar25 = pdVar25 + (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar28 != 0xa0);
          lVar28 = uVar39 * 6 + 6;
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar28) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar28)) goto LAB_006610ea;
          local_610._0_8_ = uVar39 * 6;
          local_500._0_8_ = lVar30;
          pdVar25 = (double *)
                    ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[0] +
                    (long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array[2] + 1U) * lVar30 + 0x10);
          lVar30 = 0xb8;
          do {
            dVar47 = *(double *)((long)&dStack_488 + lVar30);
            pdVar25[0xfffffffffffffffe] =
                 (double)local_5d0.m_value *
                 *(double *)
                  ((long)local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar30 + 0x40) + pdVar25[0xfffffffffffffffe];
            pdVar25[0xffffffffffffffff] = dStack_5c8 * dVar47 + pdVar25[0xffffffffffffffff];
            pdVar3 = (double *)(local_480 + lVar30);
            lVar30 = lVar30 + 0x30;
            *pdVar25 = local_300 * *pdVar3 + *pdVar25;
            pdVar25 = pdVar25 + (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar30 != 0x148);
          local_280._8_8_ = local_480 + 0x18;
          local_280._24_8_ = local_480;
          local_280._0_8_ =
               &((local_620->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0x58;
          sStack_260.m_other = 0.0;
          pStack_258.data = (double *)0x3;
          dStack_250 = 2.96439387504748e-323;
          local_240 = local_300;
          ChMatrix33<double>::operator=
                    ((ChMatrix33<double> *)local_2d8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                      *)local_280);
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar32) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar28)) goto LAB_006610ea;
          pdVar26 = (PointerType)
                    ((long)(PointerType)
                           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[0] +
                    (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[2] * lVar35);
          lVar30 = 0x10;
          do {
            dVar47 = *(double *)((long)adStack_2e8 + lVar30 + 8);
            pdVar25 = (double *)((long)pdVar26 + lVar35 + 0x18);
            dVar14 = pdVar25[1];
            pdVar3 = (double *)((long)pdVar26 + lVar35 + 0x18);
            *pdVar3 = *(double *)((long)adStack_2e8 + lVar30) + *pdVar25;
            pdVar3[1] = dVar47 + dVar14;
            pdVar25 = (double *)(local_2d8 + lVar30);
            lVar30 = lVar30 + 0x18;
            *(double *)((long)pdVar26 + lVar35 + 0x28) =
                 *pdVar25 + *(double *)((long)pdVar26 + lVar35 + 0x28);
            pdVar26 = pdVar26 + (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar30 != 0x58);
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar28) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar32)) goto LAB_006610ea;
          pCVar1 = (ChMatrix33<double> *)
                   ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[0] +
                   (local_610._0_8_ +
                   lVar32 * (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2]) * 8);
          if (((assign_op<double,_double> *)
               local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] != (assign_op<double,_double> *)0x0) &&
             ((ChMatrix33<double> *)local_2d8 == pCVar1)) {
            __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                          "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>, MightHaveTransposeAliasing = true]"
                         );
          }
          uVar39 = uVar39 + 1;
          lVar35 = lVar35 + 0x30;
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (double)local_2d8._0_8_ +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               (double)local_2c0 +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               local_2a8 +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2]] = (double)local_2d8._8_8_ +
                        (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array
                        [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[2]];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] + 1] =
               local_2b8 +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] + 1];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] + 2] =
               (double)local_2a0 +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] + 2];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] * 2] =
               (double)local_2c8.m_value +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] * 2];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] * 2U + 1] =
               local_2b0 +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] * 2U + 1];
          (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] * 2U + 2] =
               (double)local_298 +
               (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] * 2U + 2];
          lVar30 = local_500._0_8_ + 0x30;
        } while (uVar39 < (ulong)((long)(local_620->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_620->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      local_280._0_8_ =
           (local_618->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      dStack_250 = (double)(local_618->
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).m_stride.m_outer.m_value;
      local_280._8_8_ = (DstXprType *)0xc;
      local_280._16_8_ = (assign_op<double,_double> *)0xc;
      local_280._24_8_ = local_618;
      sStack_260.m_other = 0.0;
      pStack_258.data = (double *)0x0;
      if (((local_618->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         ((local_618->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < 0xc)) {
LAB_00661161:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      if ((local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
           5.92878775009496e-323) ||
         ((undefined1 *)
          local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
          (undefined1 *)0xc)) {
        pcVar27 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
LAB_0066124f:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar27);
      }
      local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_c0;
      local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)&local_580;
      local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = (double)&local_5a0;
      local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = (double)local_280;
      local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_280._0_8_;
      local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           dStack_250;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)&local_4d0);
      if ((assign_op<double,_double> *)
          local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
          (assign_op<double,_double> *)0x0) {
        free(*(void **)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] + 0xfffffffffffffff8));
      }
    }
    return;
  }
  if (this->use_numerical_diff_for_KR == true) {
    local_640.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_640.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_640,0xc);
    local_650 = (DstXprType *)0x0;
    ppCStack_648 = (ChMatrix33<double> **)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_650,0xc);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[10]
    )(this,&local_640);
    local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_580,0x90,0xc,0xc);
    psVar20 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar21 = (psVar20->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var31 = (psVar20->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_610 = *(undefined1 (*) [16])&(peVar21->super_ChNodeFEAbase).field_0x20;
      local_500._0_8_ = *(undefined8 *)&peVar21->field_0x30;
LAB_0065e8c4:
      bVar16 = true;
      p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      local_610 = *(undefined1 (*) [16])&(peVar21->super_ChNodeFEAbase).field_0x20;
      local_500._0_8_ = *(undefined8 *)&peVar21->field_0x30;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0065e8c4;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      bVar16 = false;
    }
    local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = *(double *)&peVar21->field_0x38;
    local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = *(double *)&peVar21->field_0x40;
    local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = *(double *)&peVar21->field_0x48;
    local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = *(double *)&peVar21->field_0x50;
    if (!bVar16) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    psVar20 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar21 = psVar20[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var31 = psVar20[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_5d0.m_value = *(long *)&peVar21->field_0x30;
      local_300 = *(double *)&(peVar21->super_ChNodeFEAbase).field_0x20;
      dStack_2f8 = *(double *)&peVar21->field_0x28;
LAB_0065f7d9:
      bVar16 = true;
      p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      local_300 = *(double *)&(peVar21->super_ChNodeFEAbase).field_0x20;
      dStack_2f8 = *(double *)&peVar21->field_0x28;
      local_5d0.m_value = *(long *)&peVar21->field_0x30;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0065f7d9;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      bVar16 = false;
    }
    local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         *(double *)&peVar21->field_0x38;
    local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         *(double *)&peVar21->field_0x40;
    local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         *(double *)&peVar21->field_0x48;
    local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         *(double *)&peVar21->field_0x50;
    if (!bVar16) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    lVar30 = 0;
    lVar35 = 0;
    do {
      local_480._16_8_ = local_500._0_8_;
      local_480._0_8_ = local_610._0_8_;
      local_480._8_8_ = local_610._8_8_;
      *(double *)(local_480 + lVar35 * 8) = *(double *)(local_480 + lVar35 * 8) + 1e-05;
      psVar20 = (local_620->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined8 *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_480._0_8_;
        *(undefined8 *)&peVar21->field_0x28 = local_480._8_8_;
        *(undefined8 *)&peVar21->field_0x30 = local_480._16_8_;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
        *(undefined8 *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_480._0_8_;
        *(undefined8 *)&peVar21->field_0x28 = local_480._8_8_;
        *(undefined8 *)&peVar21->field_0x30 = local_480._16_8_;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(local_620->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(local_620,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 1e-05;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (local_620->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined8 *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_610._0_8_;
        *(undefined8 *)&peVar21->field_0x28 = local_610._8_8_;
        *(undefined8 *)&peVar21->field_0x30 = local_500._0_8_;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
        *(undefined8 *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_610._0_8_;
        *(undefined8 *)&peVar21->field_0x28 = local_610._8_8_;
        *(undefined8 *)&peVar21->field_0x30 = local_500._0_8_;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      pCVar36 = local_620;
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    lVar35 = 0x18;
    lVar30 = 0;
    do {
      local_280._0_8_ = VNULL;
      local_280._8_8_ = DAT_00b689a0;
      local_280._16_8_ = DAT_00b689a8;
      *(undefined8 *)(local_280 + lVar30 * 8) = 0x3f50624dd2f1a9fc;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_280._0_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_280._16_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (double)local_280._8_8_ * (double)local_280._8_8_;
      auVar97 = vfmadd231sd_fma(auVar51,auVar78,auVar78);
      auVar97 = vfmadd213sd_fma(auVar59,auVar59,auVar97);
      auVar52 = ZEXT816(0x3ff0000000000000);
      pDVar76 = (DstEvaluatorType *)local_280._0_8_;
      dVar47 = 0.5;
      pDVar70 = (DstXprType *)local_280._8_8_;
      paVar75 = (assign_op<double,_double> *)local_280._16_8_;
      if (1e-30 < auVar97._0_8_) {
        auVar97 = vsqrtsd_avx(auVar97,auVar97);
        local_610._0_8_ = local_280._0_8_;
        local_500._8_8_ = local_280._16_8_;
        local_500._0_8_ = local_280._8_8_;
        local_130 = auVar97._0_8_;
        local_118 = local_130 * 0.5;
        dVar47 = sin(local_118);
        local_130 = dVar47 / local_130;
        auVar42._0_8_ = cos(local_118);
        auVar42._8_56_ = extraout_var;
        auVar52 = auVar42._0_16_;
        pDVar76 = (DstEvaluatorType *)local_610._0_8_;
        dVar47 = local_130;
        pDVar70 = (DstXprType *)local_500._0_8_;
        paVar75 = (assign_op<double,_double> *)local_500._8_8_;
      }
      auVar85._24_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar85._16_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar60._0_8_ = (double)pDVar70 * dVar47;
      auVar60._8_8_ = (double)paVar75 * dVar47;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = (double)pDVar76 * dVar47;
      auVar97 = vunpcklpd_avx(auVar52,auVar79);
      auVar80._8_8_ = 0;
      auVar80._0_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar40 = vpermpd_avx2(ZEXT1632(auVar97),1);
      auVar11 = vpermpd_avx2(ZEXT1632(auVar60),0x15);
      auVar56._16_16_ = auVar60;
      auVar56._0_16_ = auVar97;
      auVar66._24_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar66._16_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar89._0_8_ =
           -local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
      auVar89._8_8_ = 0x8000000000000000;
      auVar98._0_8_ =
           -local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
      auVar98._8_8_ =
           -local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
      auVar97 = vunpcklpd_avx(auVar89,auVar80);
      auVar85._0_16_ = auVar97;
      auVar66._0_16_ = auVar98;
      auVar94._0_8_ = auVar40._0_8_ * auVar97._0_8_;
      auVar94._8_8_ = auVar40._8_8_ * auVar97._8_8_;
      auVar94._16_8_ =
           auVar40._16_8_ *
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar94._24_8_ =
           auVar40._24_8_ *
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar40._8_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar40._0_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar40._16_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar40._24_8_ =
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar41 = vfmadd231pd_avx512vl(auVar94,auVar56,auVar40);
      auVar40 = vpermpd_avx2(auVar66,0x24);
      auVar54 = vpermpd_avx2(auVar56,0x5a);
      auVar56 = vpermpd_avx2(auVar85,0x66);
      auVar97 = vfmadd213pd_fma(auVar54,auVar40,auVar41);
      auVar67._16_16_ = auVar89;
      auVar67._0_16_ = auVar98;
      auVar40 = vshufpd_avx(auVar67,auVar56,9);
      auVar97 = vfmadd213pd_fma(auVar40,auVar11,ZEXT1632(auVar97));
      _local_480 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    )ZEXT1632(auVar97);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar21->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)local_480);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar30 + 3)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar35);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 0.001;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar21->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)&local_4d0);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar30 = lVar30 + 1;
      lVar35 = lVar35 + 8;
    } while (lVar30 != 3);
    lVar30 = 0x30;
    lVar35 = 0;
    do {
      gVar18 = _local_480;
      local_480._8_8_ = dStack_2f8;
      local_480._0_8_ = local_300;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)gVar18.m_dstExpr;
      local_480._16_8_ = local_5d0.m_value;
      *(double *)(local_480 + lVar35 * 8) = *(double *)(local_480 + lVar35 * 8) + 1e-05;
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined8 *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_480._0_8_;
        *(undefined8 *)&peVar21->field_0x28 = local_480._8_8_;
        *(undefined8 *)&peVar21->field_0x30 = local_480._16_8_;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
        *(undefined8 *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_480._0_8_;
        *(undefined8 *)&peVar21->field_0x28 = local_480._8_8_;
        *(undefined8 *)&peVar21->field_0x30 = local_480._16_8_;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35 + 6)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 1e-05;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(double *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_300;
        *(double *)&peVar21->field_0x28 = dStack_2f8;
        *(long *)&peVar21->field_0x30 = local_5d0.m_value;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
        *(double *)&(peVar21->super_ChNodeFEAbase).field_0x20 = local_300;
        *(double *)&peVar21->field_0x28 = dStack_2f8;
        *(long *)&peVar21->field_0x30 = local_5d0.m_value;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    lVar30 = 0x48;
    lVar35 = 0;
    do {
      local_280._0_8_ = VNULL;
      local_280._8_8_ = DAT_00b689a0;
      local_280._16_8_ = DAT_00b689a8;
      *(undefined8 *)(local_280 + lVar35 * 8) = 0x3f50624dd2f1a9fc;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_280._0_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_280._16_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = (double)local_280._8_8_ * (double)local_280._8_8_;
      auVar97 = vfmadd231sd_fma(auVar53,auVar81,auVar81);
      auVar97 = vfmadd213sd_fma(auVar61,auVar61,auVar97);
      auVar52 = ZEXT816(0x3ff0000000000000);
      pDVar76 = (DstEvaluatorType *)local_280._0_8_;
      vVar87.m_value = (long)0.5;
      pDVar70 = (DstXprType *)local_280._8_8_;
      paVar75 = (assign_op<double,_double> *)local_280._16_8_;
      if (1e-30 < auVar97._0_8_) {
        auVar97 = vsqrtsd_avx(auVar97,auVar97);
        local_610._0_8_ = local_280._0_8_;
        local_500._8_8_ = local_280._16_8_;
        local_500._0_8_ = local_280._8_8_;
        local_5d0.m_value = auVar97._0_8_;
        local_300 = (double)local_5d0.m_value * 0.5;
        dVar47 = sin(local_300);
        local_5d0.m_value = (long)(dVar47 / local_5d0.m_value);
        dStack_5c8 = extraout_XMM0_Qb;
        auVar43._0_8_ = cos(local_300);
        auVar43._8_56_ = extraout_var_00;
        auVar52 = auVar43._0_16_;
        pDVar76 = (DstEvaluatorType *)local_610._0_8_;
        vVar87.m_value = local_5d0.m_value;
        pDVar70 = (DstXprType *)local_500._0_8_;
        paVar75 = (assign_op<double,_double> *)local_500._8_8_;
      }
      auVar86._24_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar86._16_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar62._0_8_ = (double)pDVar70 * (double)vVar87.m_value;
      auVar62._8_8_ = (double)paVar75 * (double)vVar87.m_value;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = (double)pDVar76 * (double)vVar87.m_value;
      auVar97 = vunpcklpd_avx(auVar52,auVar82);
      auVar83._8_8_ = 0;
      auVar83._0_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar40 = vpermpd_avx2(ZEXT1632(auVar97),1);
      auVar11 = vpermpd_avx2(ZEXT1632(auVar62),0x15);
      auVar57._16_16_ = auVar62;
      auVar57._0_16_ = auVar97;
      auVar68._24_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar68._16_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar90._0_8_ =
           -local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar90._8_8_ = 0x8000000000000000;
      auVar99._0_8_ =
           -local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar99._8_8_ =
           -local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar97 = vunpcklpd_avx(auVar90,auVar83);
      auVar86._0_16_ = auVar97;
      auVar68._0_16_ = auVar99;
      auVar95._0_8_ = auVar40._0_8_ * auVar97._0_8_;
      auVar95._8_8_ = auVar40._8_8_ * auVar97._8_8_;
      auVar95._16_8_ =
           auVar40._16_8_ *
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar95._24_8_ =
           auVar40._24_8_ *
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar12._8_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar12._0_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar12._16_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar12._24_8_ =
           local_c0[0].super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar41 = vfmadd231pd_avx512vl(auVar95,auVar57,auVar12);
      auVar40 = vpermpd_avx2(auVar68,0x24);
      auVar54 = vpermpd_avx2(auVar57,0x5a);
      auVar56 = vpermpd_avx2(auVar86,0x66);
      auVar97 = vfmadd213pd_fma(auVar54,auVar40,auVar41);
      auVar69._16_16_ = auVar90;
      auVar69._0_16_ = auVar99;
      auVar40 = vshufpd_avx(auVar69,auVar56,9);
      auVar97 = vfmadd213pd_fma(auVar40,auVar11,ZEXT1632(auVar97));
      _local_480 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    )ZEXT1632(auVar97);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar21->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)local_480);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35 + 9)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 0.001;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar21->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)local_c0);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    if ((long)((ulong)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] |
              (ulong)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1]) < 0) goto LAB_006611be;
    local_480._0_8_ =
         (local_618->
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = (double)(local_618->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value;
    local_480._8_8_ = 0xc;
    local_480._16_8_ = 0xc;
    DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)local_618;
    DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    if (((local_618->
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value < 0xc) ||
       ((local_618->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value < 0xc)) goto LAB_00661161;
    local_280._16_8_ =
         local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_280._24_8_ =
         local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    sStack_260.m_other = (double)local_530;
    if (((undefined1 *)
         local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
         (undefined1 *)0xc) ||
       ((ChMatrixConstRef)
        local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
        (ChMatrixConstRef)0xc)) {
LAB_00661220:
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      pcVar27 = 
      "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
      ;
LAB_0066108b:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar27);
    }
    local_2d8._0_8_ = &local_350;
    local_2d8._8_8_ = local_280;
    local_2c8.m_value = (long)&local_5a0;
    local_2c0 = (DstXprType *)local_480;
    local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_480._0_8_;
    local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_2d8);
    psVar20 = (pCVar36->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar21 = (psVar20->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var31 = (psVar20->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_5a0._0_16_ = *(undefined1 (*) [16])&peVar21->field_0xa0;
      local_5a0.m_functor = *(assign_op<double,_double> **)&peVar21->field_0xb0;
LAB_006602a0:
      bVar16 = true;
      p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      local_5a0._0_16_ = *(undefined1 (*) [16])&peVar21->field_0xa0;
      local_5a0.m_functor = *(assign_op<double,_double> **)&peVar21->field_0xb0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_006602a0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      bVar16 = false;
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar21->super_ChNodeFEAbase).field_0x18);
    if (!bVar16) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    psVar20 = (pCVar36->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar21 = psVar20[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var31 = psVar20[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_5f0.m_data = *(double **)&peVar21->field_0xa0;
      local_5f0.m_rows = *(Index *)&peVar21->field_0xa8;
      local_5f0.m_cols = *(Index *)&peVar21->field_0xb0;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00660369:
      bVar16 = true;
      p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      local_5f0.m_data = *(double **)&peVar21->field_0xa0;
      local_5f0.m_rows = *(Index *)&peVar21->field_0xa8;
      local_5f0.m_cols = *(Index *)&peVar21->field_0xb0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00660369;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
      bVar16 = false;
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar21->super_ChNodeFEAbase).field_0x18);
    if (!bVar16) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    lVar30 = 0;
    lVar35 = 0;
    do {
      local_480._16_8_ = local_5a0.m_functor;
      local_480._0_8_ = local_5a0.m_dst;
      local_480._8_8_ = local_5a0.m_src;
      *(double *)(local_480 + lVar35 * 8) = *(double *)(local_480 + lVar35 * 8) + 1e-05;
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x38))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,local_480);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 1e-05;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x38))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,&local_5a0);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    lVar30 = 0x18;
    lVar35 = 0;
    do {
      gVar18 = _local_480;
      local_480._8_8_ = local_520.m_rows;
      local_480._0_8_ = local_520.m_data;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)gVar18.m_dstExpr;
      local_480._16_8_ = local_520.m_cols;
      *(double *)(local_480 + lVar35 * 8) = *(double *)(local_480 + lVar35 * 8) + 0.001;
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x48))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,local_480);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35 + 3)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 0.001;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var31 = (psVar20->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x48))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,&local_520);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    lVar30 = 0x30;
    lVar35 = 0;
    do {
      gVar18 = _local_480;
      local_480._8_8_ = local_5f0.m_rows;
      local_480._0_8_ = local_5f0.m_data;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)gVar18.m_dstExpr;
      local_480._16_8_ = local_5f0.m_cols;
      *(double *)(local_480 + lVar35 * 8) = *(double *)(local_480 + lVar35 * 8) + 1e-05;
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x38))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,local_480);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35 + 6)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 1e-05;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x38))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,&local_5f0);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    lVar30 = 0x48;
    lVar35 = 0;
    do {
      gVar18 = _local_480;
      local_480._8_8_ = local_5c0.m_rows;
      local_480._0_8_ = local_5c0.m_data;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)gVar18.m_dstExpr;
      local_480._16_8_ = local_5c0.m_cols;
      *(double *)(local_480 + lVar35 * 8) = *(double *)(local_480 + lVar35 * 8) + 0.001;
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x48))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,local_480);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      (*(pCVar36->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[10])(pCVar36,&local_650);
      if (ppCStack_648 !=
          local_640.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006610cb;
      if ((long)ppCStack_648 < 0) goto LAB_00661095;
      if (((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] < 0xc) ||
         ((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] <= lVar35 + 9)) goto LAB_006610b4;
      if (ppCStack_648 != (ChMatrix33<double> **)0xc) goto LAB_00661076;
      lVar32 = 0;
      pdVar25 = (double *)
                ((long)(PointerType)
                       local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + lVar30);
      do {
        pdVar3 = (local_650->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array + lVar32;
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar32;
        lVar32 = lVar32 + 1;
        *pdVar25 = (*pdVar3 - (double)*ppCVar22) / 0.001;
        pdVar25 = pdVar25 + (long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[2];
      } while (lVar32 != 0xc);
      psVar20 = (pCVar36->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar21 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var31 = psVar20[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)&(peVar21->super_ChNodeFEAbase).field_0x18 + 0x48))
                (&(peVar21->super_ChNodeFEAbase).field_0x18,&local_5c0);
      if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 8;
    } while (lVar35 != 3);
    if (-1 < (long)((ulong)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[2] |
                   (ulong)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[1])) {
      local_480._0_8_ =
           (local_618->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = (double)(local_618->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).m_stride.m_outer.m_value;
      local_480._8_8_ = 0xc;
      local_480._16_8_ = 0xc;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_618;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      if (((local_618->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         ((local_618->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < 0xc)) goto LAB_00661161;
      local_280._16_8_ =
           local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_280._24_8_ =
           local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      sStack_260.m_other = (double)local_5f8;
      if (((undefined1 *)
           local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
           (undefined1 *)0xc) ||
         ((ChMatrixConstRef)
          local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
          (ChMatrixConstRef)0xc)) {
        pcVar27 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
        goto LAB_0066124f;
      }
      local_2c8.m_value = (long)&local_651;
      local_2c0 = (DstXprType *)local_480;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_480._0_8_;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      local_2d8._0_8_ = &local_350;
      local_2d8._8_8_ = (SrcEvaluatorType *)local_280;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)local_2d8);
      if ((assign_op<double,_double> *)
          local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
          (assign_op<double,_double> *)0x0) {
        free(*(void **)((long)local_580.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] + 0xfffffffffffffff8));
      }
      ppCVar22 = local_640.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (local_650 != (DstXprType *)0x0) {
        free((void *)local_650[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8]);
        ppCVar22 = local_640.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
LAB_00660ad9:
      if (ppCVar22 != (pointer)0x0) {
        free(ppCVar22[-1]);
      }
      goto LAB_00660aea;
    }
  }
  else {
    local_520.m_data = (double *)0x0;
    local_520.m_rows = 0;
    local_520.m_cols = 0;
    uStack_528 = in_XMM0_Qb;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_520,0x90,0xc,0xc);
    local_5f0.m_data = (double *)0x0;
    local_5f0.m_rows = 0;
    local_5f0.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_5f0,0x90,0xc,0xc);
    local_5c0.m_cols = 0;
    local_5c0.m_data = (double *)0x0;
    local_5c0.m_rows = 0;
    ChMatrix33<double>::ChMatrix33(local_c0,&this->q_element_abs_rot);
    psVar20 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar21 = (psVar20->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var31 = (psVar20->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
    }
    auVar40 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
    auVar56 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
    auVar41 = vpermpd_avx2(auVar40,1);
    auVar54._0_8_ = *(ulong *)&peVar21->field_0x40 ^ 0x8000000000000000;
    auVar54._8_8_ = *(ulong *)&peVar21->field_0x48 ^ 0x8000000000000000;
    auVar54._16_8_ = 0x8000000000000000;
    auVar54._24_8_ = 0x8000000000000000;
    uVar39 = *(ulong *)&peVar21->field_0x50 ^ 0x8000000000000000;
    auVar73._24_8_ = 0x8000000000000000;
    auVar73._16_8_ = uVar39;
    auVar11 = vpermpd_avx2(auVar54,0xd0);
    auVar100._8_8_ = uVar39;
    auVar100._0_8_ = uVar39;
    auVar100._16_8_ = uVar39;
    auVar100._24_8_ = uVar39;
    auVar73._0_16_ = *(undefined1 (*) [16])&peVar21->field_0x48;
    auVar64._16_8_ = *(ulong *)&peVar21->field_0x40;
    auVar64._0_16_ = *(undefined1 (*) [16])&peVar21->field_0x48;
    auVar64._24_8_ = 0;
    auVar54 = vpermpd_avx2(auVar54,0x11);
    auVar11 = vblendpd_avx(auVar11,ZEXT832(*(ulong *)&peVar21->field_0x40),1);
    auVar11 = vblendpd_avx(auVar11,auVar100,8);
    auVar73 = vpermpd_avx2(auVar73,0x24);
    auVar54 = vshufpd_avx(auVar64,auVar54,9);
    auVar91._0_8_ = auVar41._0_8_ * auVar11._0_8_;
    auVar91._8_8_ = auVar41._8_8_ * auVar11._8_8_;
    auVar91._16_8_ = auVar41._16_8_ * auVar11._16_8_;
    auVar91._24_8_ = auVar41._24_8_ * auVar11._24_8_;
    uVar4 = *(undefined8 *)&peVar21->field_0x38;
    auVar11._8_8_ = uVar4;
    auVar11._0_8_ = uVar4;
    auVar11._16_8_ = uVar4;
    auVar11._24_8_ = uVar4;
    auVar40 = vfmadd231pd_avx512vl(auVar91,auVar40,auVar11);
    dVar47 = (this->q_element_abs_rot).m_data[2];
    auVar41._8_8_ = dVar47;
    auVar41._0_8_ = dVar47;
    dVar47 = (this->q_element_abs_rot).m_data[1];
    auVar41._24_8_ = dVar47;
    auVar41._16_8_ = dVar47;
    auVar97 = vfmadd213pd_fma(auVar41,auVar73,auVar40);
    auVar97 = vfmadd213pd_fma(auVar54,auVar56,ZEXT1632(auVar97));
    _local_480 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  )ZEXT1632(auVar97);
    ChMatrix33<double>::ChMatrix33(&local_350,(ChQuaternion<double> *)local_480);
    if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    psVar20 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar21 = psVar20[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var31 = psVar20[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      }
    }
    auVar40 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
    auVar56 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
    auVar41 = vpermpd_avx2(auVar40,1);
    auVar55._0_8_ = *(ulong *)&peVar21->field_0x40 ^ 0x8000000000000000;
    auVar55._8_8_ = *(ulong *)&peVar21->field_0x48 ^ 0x8000000000000000;
    auVar55._16_8_ = 0x8000000000000000;
    auVar55._24_8_ = 0x8000000000000000;
    uVar39 = *(ulong *)&peVar21->field_0x50 ^ 0x8000000000000000;
    auVar74._24_8_ = 0x8000000000000000;
    auVar74._16_8_ = uVar39;
    auVar11 = vpermpd_avx2(auVar55,0xd0);
    auVar101._8_8_ = uVar39;
    auVar101._0_8_ = uVar39;
    auVar101._16_8_ = uVar39;
    auVar101._24_8_ = uVar39;
    auVar74._0_16_ = *(undefined1 (*) [16])&peVar21->field_0x48;
    auVar65._16_8_ = *(ulong *)&peVar21->field_0x40;
    auVar65._0_16_ = *(undefined1 (*) [16])&peVar21->field_0x48;
    auVar65._24_8_ = 0;
    auVar54 = vpermpd_avx2(auVar55,0x11);
    auVar11 = vblendpd_avx(auVar11,ZEXT832(*(ulong *)&peVar21->field_0x40),1);
    auVar11 = vblendpd_avx(auVar11,auVar101,8);
    auVar73 = vpermpd_avx2(auVar74,0x24);
    auVar54 = vshufpd_avx(auVar65,auVar54,9);
    auVar92._0_8_ = auVar41._0_8_ * auVar11._0_8_;
    auVar92._8_8_ = auVar41._8_8_ * auVar11._8_8_;
    auVar92._16_8_ = auVar41._16_8_ * auVar11._16_8_;
    auVar92._24_8_ = auVar41._24_8_ * auVar11._24_8_;
    uVar4 = *(undefined8 *)&peVar21->field_0x38;
    auVar13._8_8_ = uVar4;
    auVar13._0_8_ = uVar4;
    auVar13._16_8_ = uVar4;
    auVar13._24_8_ = uVar4;
    auVar40 = vfmadd231pd_avx512vl(auVar92,auVar40,auVar13);
    dVar47 = (this->q_element_abs_rot).m_data[2];
    auVar84._8_8_ = dVar47;
    auVar84._0_8_ = dVar47;
    dVar47 = (this->q_element_abs_rot).m_data[1];
    auVar84._24_8_ = dVar47;
    auVar84._16_8_ = dVar47;
    auVar97 = vfmadd213pd_fma(auVar84,auVar73,auVar40);
    auVar97 = vfmadd213pd_fma(auVar54,auVar56,ZEXT1632(auVar97));
    _local_480 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  )ZEXT1632(auVar97);
    ChMatrix33<double>::ChMatrix33(&local_580,(ChQuaternion<double> *)local_480);
    if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    local_640.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_640.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
    local_640.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
    local_480._0_8_ = local_c0;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_640,(iterator)0x0,(ChMatrix33<double> **)local_480);
    if (local_640.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_640.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_480._0_8_ = &local_350;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_640,
                 (iterator)
                 local_640.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_480);
    }
    else {
      *local_640.
       super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = &local_350;
      local_640.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_640.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_640.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_640.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_480._0_8_ = local_c0;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_640,
                 (iterator)
                 local_640.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_480);
    }
    else {
      *local_640.
       super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = local_c0;
      local_640.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_640.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_480._0_8_ = &local_580;
    if (local_640.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_640.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_640,
                 (iterator)
                 local_640.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_480);
    }
    else {
      *local_640.
       super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = &local_580;
      local_640.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_640.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (this->use_geometric_stiffness == true) {
      iVar19 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                 _vptr_ChElementBase[3])(this);
      local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4d0,(long)iVar19
                );
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [6])(this,&local_4d0);
      paVar75 = (assign_op<double,_double> *)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      pDVar10 = (DstXprType *)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols;
      if ((long)pDVar10 < 0 && paVar75 != (assign_op<double,_double> *)0x0) {
        pcVar27 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
        ;
        goto LAB_0066126e;
      }
      uVar39 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_rows;
      if ((long)uVar39 < 1) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                     );
      }
      if (pDVar10 !=
          (DstXprType *)
          local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1]) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_480._8_8_ = paVar75;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)pDVar10;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)&this->Km;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = (double)pDVar10;
      local_2d8._0_8_ = (ChMatrix33<double> *)(local_2d8 + 8);
      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = (double)&local_4d0;
      if (pDVar10 == (DstXprType *)0x0) {
        local_2d8._8_8_ = (SrcEvaluatorType *)0x0;
        uVar37 = 0;
      }
      else {
        if ((long)pDVar10 < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        pStack_258.data =
             (double *)
             local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0];
        local_280._16_8_ = paVar75;
        sStack_260.m_other = (double)pDVar10;
        local_2d8._8_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_280,(scalar_sum_op<double,_double> *)&local_5a0,
                        (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_480);
        uVar39 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        uVar37 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
      }
      if (-1 < (long)(uVar37 | uVar39)) {
        auVar15._8_8_ = uStack_528;
        auVar15._0_8_ = local_530;
        uVar38 = (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
        uVar24 = (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        uVar29 = uVar38 | uVar24;
        if (-1 < (long)uVar29) {
          if ((uVar39 != uVar24) || (uVar37 != uVar38)) {
            pcVar27 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>]"
            ;
            goto LAB_006610e0;
          }
          auVar93._8_8_ = 0;
          auVar93._0_8_ =
               (((Matrix<double,_3,_3,_1,_3,_3> *)local_2d8._0_8_)->
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
               [0];
          pdVar25 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_data;
          pdVar3 = (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
          auVar96._8_8_ = 0;
          auVar96._0_8_ =
               ((this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->rdamping_beta;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_5f8;
          auVar97 = vfmadd132sd_fma(auVar96,auVar15,auVar5);
          if ((local_5c0.m_rows != uVar39) ||
             (uVar38 = uVar37, uVar24 = uVar39, local_5c0.m_cols != uVar37)) {
            local_610 = auVar93;
            local_500 = auVar97;
            if ((uVar37 != 0 && uVar39 != 0) &&
               (auVar97 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
               SUB168(auVar97 / SEXT816((long)uVar37),0) < (long)uVar39)) {
              puVar23 = (undefined8 *)
                        __cxa_allocate_exception(8,uVar29,SUB168(auVar97 % SEXT816((long)uVar37),0))
              ;
              *puVar23 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar23,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                      (&local_5c0,uVar37 * uVar39,uVar39,uVar37);
            uVar38 = local_5c0.m_cols;
            uVar24 = local_5c0.m_rows;
            auVar97 = local_500;
            auVar93 = local_610;
          }
          if ((uVar24 != uVar39) || (uVar38 != uVar37)) {
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>>, T1 = double, T2 = double]"
                         );
          }
          uVar37 = uVar37 * uVar39;
          uVar39 = uVar37 + 7;
          if (-1 < (long)uVar37) {
            uVar39 = uVar37;
          }
          uVar39 = uVar39 & 0xfffffffffffffff8;
          if (7 < (long)uVar37) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_530;
            auVar42 = vbroadcastsd_avx512f(auVar6);
            auVar43 = vbroadcastsd_avx512f(auVar97);
            auVar44 = vbroadcastsd_avx512f(auVar93);
            lVar30 = 0;
            do {
              auVar45 = vmulpd_avx512f(auVar44,*(undefined1 (*) [64])(pdVar3 + lVar30));
              auVar46 = vmulpd_avx512f(auVar43,*(undefined1 (*) [64])(pdVar25 + lVar30));
              auVar45 = vmulpd_avx512f(auVar42,auVar45);
              auVar45 = vaddpd_avx512f(auVar46,auVar45);
              *(undefined1 (*) [64])(local_5c0.m_data + lVar30) = auVar45;
              lVar30 = lVar30 + 8;
            } while (lVar30 < (long)uVar39);
          }
          if ((long)uVar39 < (long)uVar37) {
            do {
              local_5c0.m_data[uVar39] =
                   auVar97._0_8_ * pdVar25[uVar39] +
                   auVar93._0_8_ * pdVar3[uVar39] * (double)local_530;
              uVar39 = uVar39 + 1;
            } while (uVar37 - uVar39 != 0);
          }
          this = local_620;
          if ((DstEvaluatorType *)
              local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] != (DstEvaluatorType *)0x0) {
            free((void *)(((DstEvaluatorType *)
                          ((long)local_4d0.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[0] + -0x18))->
                         super_block_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                         ).
                         super_mapbase_evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                         .m_outerStride.m_value);
            this = local_620;
          }
          goto LAB_0065edc0;
        }
      }
    }
    else {
      vVar87.m_value =
           (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols;
      uVar39 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_rows;
      if (-1 < (long)(vVar87.m_value | uVar39)) {
        auVar52._8_8_ = uStack_528;
        auVar52._0_8_ = local_530;
        auVar48._8_8_ = 0;
        auVar48._0_8_ =
             ((this->section).
              super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->rdamping_beta;
        local_480._8_8_ = uVar39;
        local_480._0_8_ = &this->Km;
        local_480._16_8_ = vVar87.m_value;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = local_5f8;
        auVar97 = vfmadd132sd_fma(auVar48,auVar52,auVar97);
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)auVar97._0_8_;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_5c0,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_480,(assign_op<double,_double> *)local_280);
LAB_0065edc0:
        local_480._0_16_ = ZEXT816(0);
        _local_480 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                      )ZEXT1632(local_480._0_16_);
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = 0.0;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = 0.0;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = 0.0;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_480,&local_5c0);
        local_e8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_e8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_520.m_data;
        local_e8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_520.m_rows;
        local_e8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = local_520.m_cols;
        if ((local_520.m_rows | local_520.m_cols) < 0 && (pointer)local_520.m_data != (pointer)0x0)
        {
LAB_00661209:
          pcVar27 = 
          "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
          ;
LAB_0066126e:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar27);
        }
        local_e8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = local_520.m_cols;
        ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_480,&local_640,4,&local_e8);
        if (DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
            .array[2] != 0.0) {
          free(*(void **)((long)DStack_468.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[2] + -8));
        }
        local_480._0_16_ = ZEXT816(0);
        _local_480 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                      )ZEXT1632(local_480._0_16_);
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = 0.0;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = 0.0;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = 0.0;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_480,&local_520);
        local_110.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_110.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_5f0.m_data;
        local_110.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_5f0.m_rows;
        local_110.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = local_5f0.m_cols;
        if ((local_5f0.m_rows | local_5f0.m_cols) < 0 &&
            (DstEvaluatorType *)local_5f0.m_data != (DstEvaluatorType *)0x0) goto LAB_00661209;
        local_110.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = local_5f0.m_cols;
        ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)local_480,&local_640,4,&local_110);
        if (DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
            .array[2] != 0.0) {
          free(*(void **)((long)DStack_468.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[2] + -8));
        }
        pCVar36 = local_620;
        if (this->force_symmetric_stiffness == true) {
          lVar30 = 1;
          uVar39 = 1;
          if (1 < local_5f0.m_rows) {
            uVar39 = local_5f0.m_rows;
          }
          if (uVar39 != 1) {
            lVar28 = 8;
            lVar33 = 0;
            lVar32 = local_5f0.m_cols * 8;
            lVar35 = local_5f0.m_cols * 8 + 8;
            uVar37 = local_5f0.m_rows;
            do {
              uVar37 = uVar37 - 1;
              lVar33 = lVar33 + 1;
              if (lVar33 < local_5f0.m_cols) {
                uVar38 = 0;
                puVar23 = (undefined8 *)
                          ((long)&(((block_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                                     *)local_5f0.m_data)->
                                  super_mapbase_evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                  ).m_data + lVar32);
                do {
                  if (uVar37 == uVar38) {
                    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                                 );
                  }
                  uVar4 = *puVar23;
                  lVar2 = lVar30 + 1 + uVar38;
                  puVar23 = puVar23 + local_5f0.m_cols;
                  *(undefined8 *)
                   ((long)&(((block_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                              *)local_5f0.m_data)->
                           super_mapbase_evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                           ).m_data + uVar38 * 8 + lVar28) = uVar4;
                  uVar38 = uVar38 + 1;
                } while (lVar2 < local_5f0.m_cols);
              }
              lVar30 = lVar30 + 1;
              lVar28 = lVar28 + lVar35;
              lVar32 = lVar32 + lVar35;
            } while (lVar33 != uVar39 - 1);
          }
        }
        local_480._0_8_ =
             (local_618->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = (double)(local_618->
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).m_stride.m_outer.m_value;
        local_480._8_8_ = 0xc;
        local_480._16_8_ = 0xc;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_618;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = 0.0;
        DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = 0.0;
        if (((local_618->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < 0xc) ||
           ((local_618->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value < 0xc)) goto LAB_00661161;
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_5f0.m_data;
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)local_5f0.m_cols;
        if ((local_5f0.m_rows != 0xc) || ((DstXprType *)local_5f0.m_cols != (DstXprType *)0xc))
        goto LAB_00661220;
        local_280._0_8_ = local_2d8;
        local_280._8_8_ = &local_4d0;
        local_280._16_8_ = &local_5a0;
        local_2d8._0_8_ = local_480._0_8_;
        local_2c8.m_value =
             (long)DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data.array[3];
        local_280._24_8_ = (ChMatrixConstRef)local_480;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_280);
        peVar34 = (pCVar36->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if ((peVar34->compute_inertia_damping_matrix != false) ||
           (peVar34->compute_inertia_stiffness_matrix == true)) {
          dStack_180 = 0.0;
          dStack_178 = 0.0;
          dStack_170 = 0.0;
          dStack_168 = 0.0;
          local_1c0 = 0.0;
          dStack_1b8 = 0.0;
          dStack_1b0 = 0.0;
          dStack_1a8 = 0.0;
          dStack_1a0 = 0.0;
          dStack_198 = 0.0;
          dStack_190 = 0.0;
          dStack_188 = 0.0;
          local_200 = 0.0;
          dStack_1f8 = 0.0;
          dStack_1f0 = 0.0;
          dStack_1e8 = 0.0;
          dStack_1e0 = 0.0;
          dStack_1d8 = 0.0;
          dStack_1d0 = 0.0;
          dStack_1c8 = 0.0;
          local_240 = 0.0;
          dStack_238 = 0.0;
          dStack_230 = 0.0;
          dStack_228 = 0.0;
          dStack_220 = 0.0;
          dStack_218 = 0.0;
          dStack_210 = 0.0;
          dStack_208 = 0.0;
          local_280._0_8_ = (DstEvaluatorType *)0x0;
          local_280._8_8_ = (DstXprType *)0x0;
          local_280._16_8_ = (assign_op<double,_double> *)0x0;
          local_280._24_8_ = (ChMatrixConstRef)0x0;
          sStack_260.m_other = 0.0;
          pStack_258.data = (double *)0x0;
          dStack_250 = 0.0;
          dStack_248 = 0.0;
          psVar20 = (pCVar36->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pCVar36->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != psVar20) {
            uVar39 = 0;
            dStack_4f0 = (pCVar36->super_ChElementBeam).length * 0.5;
            local_610._0_8_ = 0x18;
            local_300 = dStack_4f0 * (double)local_530;
            dStack_4f0 = dStack_4f0 * (double)local_5f8;
            local_500._8_8_ = dStack_4f0;
            local_500._0_8_ = dStack_4f0;
            dStack_2f8 = local_300;
            dStack_2f0 = local_300;
            adStack_2e8[0] = local_300;
            dStack_4e8 = dStack_4f0;
            do {
              peVar34 = (pCVar36->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (peVar34->compute_inertia_damping_matrix == true) {
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &((psVar20[uVar39].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                (*(peVar34->super_ChBeamSection)._vptr_ChBeamSection[0xe])
                          (peVar34,local_480,local_2d8);
                local_280._0_8_ =
                     (DstEvaluatorType *)
                     ((double)local_500._0_8_ * (double)local_480._0_8_ + (double)local_280._0_8_);
                local_280._8_8_ =
                     (DstXprType *)
                     ((double)local_500._8_8_ * (double)local_480._8_8_ + (double)local_280._8_8_);
                local_280._16_8_ =
                     (assign_op<double,_double> *)
                     (dStack_4f0 * (double)local_480._16_8_ + (double)local_280._16_8_);
                local_280._24_8_ =
                     (ChMatrixConstRef)
                     (dStack_4e8 *
                      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0] + (double)local_280._24_8_);
                sStack_260.m_other =
                     (double)((double)local_500._0_8_ *
                              DStack_468.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1] + sStack_260.m_other);
                pStack_258.data =
                     (double *)
                     ((double)local_500._8_8_ *
                      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] + pStack_258.data);
                dStack_250 = dStack_4f0 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[3] + dStack_250;
                dStack_248 = dStack_4e8 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[4] + dStack_248;
                local_240 = (double)local_500._0_8_ *
                            DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[5] + local_240;
                dStack_238 = (double)local_500._8_8_ *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[6] + dStack_238;
                dStack_230 = dStack_4f0 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[7] + dStack_230;
                dStack_228 = dStack_4e8 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[8] + dStack_228;
                dStack_220 = (double)local_500._0_8_ * local_420 + dStack_220;
                dStack_218 = (double)local_500._8_8_ * dStack_418 + dStack_218;
                dStack_210 = dStack_4f0 * dStack_410 + dStack_210;
                dStack_208 = dStack_4e8 * dStack_408 + dStack_208;
                local_200 = (double)local_500._0_8_ * local_400 + local_200;
                dStack_1f8 = (double)local_500._8_8_ * dStack_3f8 + dStack_1f8;
                dStack_1f0 = dStack_4f0 * dStack_3f0 + dStack_1f0;
                dStack_1e8 = dStack_4e8 * dStack_3e8 + dStack_1e8;
                dStack_1e0 = (double)local_500._0_8_ * local_3e0 + dStack_1e0;
                dStack_1d8 = (double)local_500._8_8_ * dStack_3d8 + dStack_1d8;
                dStack_1d0 = dStack_4f0 * dStack_3d0 + dStack_1d0;
                dStack_1c8 = dStack_4e8 * dStack_3c8 + dStack_1c8;
                local_1c0 = (double)local_500._0_8_ * local_3c0 + local_1c0;
                dStack_1b8 = (double)local_500._8_8_ * dStack_3b8 + dStack_1b8;
                dStack_1b0 = dStack_4f0 * dStack_3b0 + dStack_1b0;
                dStack_1a8 = dStack_4e8 * dStack_3a8 + dStack_1a8;
                dStack_1a0 = (double)local_500._0_8_ * local_3a0 + dStack_1a0;
                dStack_198 = (double)local_500._8_8_ * dStack_398 + dStack_198;
                dStack_190 = dStack_4f0 * dStack_390 + dStack_190;
                dStack_188 = dStack_4e8 * dStack_388 + dStack_188;
                dStack_180 = (double)local_500._0_8_ * local_380 + dStack_180;
                dStack_178 = (double)local_500._8_8_ * dStack_378 + dStack_178;
                dStack_170 = dStack_4f0 * dStack_370 + dStack_170;
                dStack_168 = dStack_4e8 * dStack_368 + dStack_168;
                peVar34 = (pCVar36->section).
                          super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
              }
              if (peVar34->compute_inertia_stiffness_matrix == true) {
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &(((pCVar36->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar39].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                ChFrameMoving<double>::GetWacc_loc
                          ((ChFrameMoving<double> *)
                           &(((pCVar36->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar39].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                peVar21 = (pCVar36->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar39].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *(double *)&peVar21->field_0xe0;
                auVar88._8_8_ = 0;
                auVar88._0_8_ = *(ulong *)&peVar21->field_0x70;
                auVar71._8_8_ = *(undefined8 *)&peVar21->field_0xd8;
                auVar71._0_8_ = *(undefined8 *)&peVar21->field_0xd8;
                auVar77._8_8_ = *(undefined8 *)&peVar21->field_0xe8;
                auVar77._0_8_ = *(undefined8 *)&peVar21->field_0xe8;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)&peVar21->field_0x68;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = *(double *)&peVar21->field_0xe0 * *(double *)&peVar21->field_0x80;
                auVar48 = vfmadd231sd_fma(auVar58,auVar71,auVar7);
                auVar52 = vunpcklpd_avx(auVar88,auVar49);
                auVar97 = vmovhpd_avx(auVar49,*(undefined8 *)&peVar21->field_0x78);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)&peVar21->field_0x98;
                auVar48 = vfmadd231sd_fma(auVar48,auVar77,auVar8);
                auVar50._0_8_ = auVar52._0_8_ * auVar97._0_8_;
                auVar50._8_8_ = auVar52._8_8_ * auVar97._8_8_;
                auVar97 = vfmadd231pd_fma(auVar50,auVar71,*(undefined1 (*) [16])&peVar21->field_0x58
                                         );
                local_5a0._0_16_ =
                     vfmadd231pd_fma(auVar97,auVar77,*(undefined1 (*) [16])&peVar21->field_0x88);
                local_5a0.m_functor = auVar48._0_8_;
                (*(peVar34->super_ChBeamSection)._vptr_ChBeamSection[0xf])
                          (peVar34,local_480,local_2d8,&local_4d0,&local_5a0);
                local_280._0_8_ =
                     (DstEvaluatorType *)
                     (local_300 * (double)local_480._0_8_ + (double)local_280._0_8_);
                local_280._8_8_ =
                     (DstXprType *)(dStack_2f8 * (double)local_480._8_8_ + (double)local_280._8_8_);
                local_280._16_8_ =
                     (assign_op<double,_double> *)
                     (dStack_2f0 * (double)local_480._16_8_ + (double)local_280._16_8_);
                local_280._24_8_ =
                     (ChMatrixConstRef)
                     (adStack_2e8[0] *
                      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0] + (double)local_280._24_8_);
                sStack_260.m_other =
                     (double)(local_300 *
                              DStack_468.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1] + sStack_260.m_other);
                pStack_258.data =
                     (double *)
                     (dStack_2f8 *
                      DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] + (double)pStack_258.data);
                dStack_250 = dStack_2f0 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[3] + dStack_250;
                dStack_248 = adStack_2e8[0] *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[4] + dStack_248;
                local_240 = local_300 *
                            DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[5] + local_240;
                dStack_238 = dStack_2f8 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[6] + dStack_238;
                dStack_230 = dStack_2f0 *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[7] + dStack_230;
                dStack_228 = adStack_2e8[0] *
                             DStack_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                             .m_storage.m_data.array[8] + dStack_228;
                dStack_220 = local_300 * local_420 + dStack_220;
                dStack_218 = dStack_2f8 * dStack_418 + dStack_218;
                dStack_210 = dStack_2f0 * dStack_410 + dStack_210;
                dStack_208 = adStack_2e8[0] * dStack_408 + dStack_208;
                local_200 = local_300 * local_400 + local_200;
                dStack_1f8 = dStack_2f8 * dStack_3f8 + dStack_1f8;
                dStack_1f0 = dStack_2f0 * dStack_3f0 + dStack_1f0;
                dStack_1e8 = adStack_2e8[0] * dStack_3e8 + dStack_1e8;
                dStack_1e0 = local_300 * local_3e0 + dStack_1e0;
                dStack_1d8 = dStack_2f8 * dStack_3d8 + dStack_1d8;
                dStack_1d0 = dStack_2f0 * dStack_3d0 + dStack_1d0;
                dStack_1c8 = adStack_2e8[0] * dStack_3c8 + dStack_1c8;
                local_1c0 = local_300 * local_3c0 + local_1c0;
                dStack_1b8 = dStack_2f8 * dStack_3b8 + dStack_1b8;
                dStack_1b0 = dStack_2f0 * dStack_3b0 + dStack_1b0;
                dStack_1a8 = adStack_2e8[0] * dStack_3a8 + dStack_1a8;
                dStack_1a0 = local_300 * local_3a0 + dStack_1a0;
                dStack_198 = dStack_2f8 * dStack_398 + dStack_198;
                dStack_190 = dStack_2f0 * dStack_390 + dStack_190;
                dStack_188 = adStack_2e8[0] * dStack_388 + dStack_188;
                dStack_180 = local_300 * local_380 + dStack_180;
                dStack_178 = dStack_2f8 * dStack_378 + dStack_178;
                dStack_170 = dStack_2f0 * dStack_370 + dStack_170;
                dStack_168 = adStack_2e8[0] * dStack_368 + dStack_168;
              }
              pRVar17 = local_618;
              pCVar36 = local_620;
              lVar35 = uVar39 * 6;
              lVar30 = lVar35 + 6;
              if (((local_618->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_rows.m_value < lVar30) ||
                 ((local_618->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value < lVar30)) {
LAB_0066114a:
                pcVar27 = 
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
                ;
                goto LAB_006610ff;
              }
              lVar32 = (local_618->
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).m_stride.m_outer.m_value;
              pdVar25 = (double *)
                        ((long)(local_618->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               ).
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_data + (lVar32 + 1) * local_610._0_8_ + 0x10);
              lVar28 = 0xb8;
              do {
                dVar47 = *(double *)(local_280 + lVar28 + -8);
                pdVar25[-2] = *(double *)((long)adStack_290 + lVar28) + pdVar25[-2];
                pdVar25[-1] = dVar47 + pdVar25[-1];
                pdVar3 = (double *)(local_280 + lVar28);
                lVar28 = lVar28 + 0x30;
                *pdVar25 = *pdVar3 + *pdVar25;
                pdVar25 = pdVar25 + lVar32;
              } while (lVar28 != 0x148);
              if (((local_618->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_rows.m_value < lVar35 + 3) ||
                 ((local_618->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value < lVar30)) goto LAB_0066114a;
              lVar30 = (local_618->
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).m_stride.m_outer.m_value;
              pdVar26 = (local_618->
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        ).
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_data;
              local_2d8._8_8_ = local_280 + 0x18;
              local_2c0 = (DstXprType *)local_280;
              local_2b8 = 0.0;
              local_2b0 = 1.48219693752374e-323;
              local_2a8 = 2.96439387504748e-323;
              local_2d8._0_8_ =
                   &((local_620->nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar39].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->field_0x58;
              adStack_290[1] = 1.48219693752374e-323;
              local_650 = &local_4d0;
              local_5a0.m_functor = &local_651;
              local_5a0.m_src = (SrcEvaluatorType *)local_2d8;
              local_5a0.m_dst = (DstEvaluatorType *)&local_650;
              local_5a0.m_dstExpr = local_650;
              local_2a0 = (ChMatrix33<double> *)local_2d8._0_8_;
              local_298 = (SrcEvaluatorType *)local_2d8._8_8_;
              Eigen::internal::
              copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
              ::run(&local_5a0);
              pdVar26 = pdVar26 + lVar35 + 3 + lVar35 * lVar30;
              lVar30 = (pRVar17->
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).m_stride.m_outer.m_value;
              local_610._0_8_ = local_610._0_8_ + 0x30;
              uVar39 = uVar39 + 1;
              *pdVar26 = local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0] + *pdVar26;
              pdVar26[1] = local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[3] + pdVar26[1];
              pdVar26[2] = local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[6] + pdVar26[2];
              pdVar26[lVar30] =
                   local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1] + pdVar26[lVar30];
              pdVar26[lVar30 + 1] =
                   local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] + pdVar26[lVar30 + 1];
              pdVar26[lVar30 + 2] =
                   local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7] + pdVar26[lVar30 + 2];
              pdVar26[lVar30 * 2] =
                   local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2] + pdVar26[lVar30 * 2];
              pdVar26[lVar30 * 2 + 1] =
                   local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5] + pdVar26[lVar30 * 2 + 1];
              pdVar26[lVar30 * 2 + 2] =
                   local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[8] + pdVar26[lVar30 * 2 + 2];
              psVar20 = (pCVar36->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar39 < (ulong)((long)(pCVar36->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)psVar20 >> 4));
          }
        }
        if (local_640.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_640.
                          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_640.
                                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_640.
                                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_5c0.m_data != (double *)0x0) {
          free((void *)local_5c0.m_data[-1]);
        }
        ppCVar22 = (pointer)local_520.m_data;
        if ((DstEvaluatorType *)local_5f0.m_data != (DstEvaluatorType *)0x0) {
          free((void *)(((DstEvaluatorType *)((long)local_5f0.m_data + -0x18))->
                       super_block_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                       ).
                       super_mapbase_evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_outerStride.m_value);
          ppCVar22 = (pointer)local_520.m_data;
        }
        goto LAB_00660ad9;
      }
    }
  }
LAB_006611be:
  pcVar27 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_006610aa:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar27);
LAB_00661095:
  pcVar27 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_006610aa;
LAB_00661076:
  pcVar27 = 
  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 12, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 12, 1>]"
  ;
  goto LAB_0066108b;
LAB_006610b4:
  pcVar27 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 12, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 12, BlockCols = 1, InnerPanel = false]"
  ;
LAB_006610ff:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar27);
LAB_006610cb:
  pcVar27 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
LAB_006610e0:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar27);
}

Assistant:

void ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(section);

    //
    // The K stiffness matrix and R damping matrix of this element:
    //

    if (Kfactor || Rfactor) {

        if (use_numerical_diff_for_KR) {

            // numerical evaluation of the K R  matrices
            double delta_p = 1e-5;
            double delta_r = 1e-3;

            ChVectorDynamic<> Fi0(12);
            ChVectorDynamic<> FiD(12);
            this->ComputeInternalForces(Fi0);
            ChMatrixDynamic<> H_num(12, 12);

            // K
            ChVector<>     pa0 = this->GetNodeA()->GetPos();
            ChQuaternion<> qa0 = this->GetNodeA()->GetRot();
            ChVector<>     pb0 = this->GetNodeB()->GetPos();
            ChQuaternion<> qb0 = this->GetNodeB()->GetRot();
            for (int i = 0; i < 3; ++i) {
                ChVector<> paD = pa0; 
                paD[i] += delta_p;
                this->GetNodeA()->SetPos(paD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i) = (FiD - Fi0) / delta_p;
                this->GetNodeA()->SetPos(pa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> rotator(VNULL);  rotator[i] = delta_r;
                ChQuaternion<> mdeltarotL;  mdeltarotL.Q_from_Rotv(rotator); // rot.in local basis - as in system wide vectors
                ChQuaternion<> qaD = qa0 * mdeltarotL;
                this->GetNodeA()->SetRot(qaD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+3) = (FiD - Fi0) / delta_r;
                this->GetNodeA()->SetRot(qa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> pbD = pb0; 
                pbD[i] += delta_p;
                this->GetNodeB()->SetPos(pbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+6) = (FiD - Fi0) / delta_p;
                this->GetNodeB()->SetPos(pb0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> rotator(VNULL);  rotator[i] = delta_r;
                ChQuaternion<> mdeltarotL;  mdeltarotL.Q_from_Rotv(rotator); // rot.in local basis - as in system wide vectors
                ChQuaternion<> qbD = qb0 * mdeltarotL;
                this->GetNodeB()->SetRot(qbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+9) = (FiD - Fi0) / delta_r;
                this->GetNodeB()->SetRot(qb0);
            }
            H.block(0, 0, 12, 12) = - H_num * Kfactor;

            // R
            ChVector<> va0 = this->GetNodeA()->GetPos_dt();
            ChVector<> wa0 = this->GetNodeA()->GetWvel_loc();
            ChVector<> vb0 = this->GetNodeB()->GetPos_dt();
            ChVector<> wb0 = this->GetNodeB()->GetWvel_loc();
            for (int i = 0; i < 3; ++i) {
                ChVector<> vaD = va0; 
                vaD[i] += delta_p;
                this->GetNodeA()->SetPos_dt(vaD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i) = (FiD - Fi0) / delta_p;
                this->GetNodeA()->SetPos_dt(va0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> waD = wa0; 
                waD[i] += delta_r;
                this->GetNodeA()->SetWvel_loc(waD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+3) = (FiD - Fi0) / delta_r;
                this->GetNodeA()->SetWvel_loc(wa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> vbD = vb0; 
                vbD[i] += delta_p;
                this->GetNodeB()->SetPos_dt(vbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+6) = (FiD - Fi0) / delta_p;
                this->GetNodeB()->SetPos_dt(vb0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> wbD = wb0; 
                wbD[i] += delta_r;
                this->GetNodeB()->SetWvel_loc(wbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+9) = (FiD - Fi0) / delta_r;
                this->GetNodeB()->SetWvel_loc(wb0);
            }
            H.block(0, 0, 12, 12) += - H_num * Rfactor;

        }
        else {

            // Corotational K stiffness:
            ChMatrixDynamic<> CK(12, 12);
            ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix


            ChMatrixDynamic<> H_local;

            //
            // Corotate local stiffness matrix
            //

            ChMatrix33<> Atoabs(this->q_element_abs_rot);
            ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            std::vector<ChMatrix33<>*> R;
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelA);
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelB);

            if (this->use_geometric_stiffness) {
                // K = Km+Kg

                // For Kg, compute Px tension of the beam along centerline, using temporary but fast data structures:
                ChVectorDynamic<> displ(this->GetNdofs());
                this->GetStateBlock(displ);
                double Px = -this->Km.row(0) * displ;

                // Rayleigh damping (stiffness proportional part)  [R] = beta*[Km] , so H = kf*[Km+Kg]+rf*[R] = (kf+rf*beta)*[Km] + kf*Kg
                H_local = this->Km * (Kfactor + Rfactor * this->section->GetBeamRaleyghDampingBeta()) + this->Kg * Px * Kfactor;
            }
            else {
                // K = Km

                // Rayleigh damping (stiffness proportional part)  [R] = beta*[Km] , so H = kf*[Km]+rf*[R] = (kf+rf*beta)*[K]
                H_local = this->Km * (Kfactor + Rfactor * this->section->GetBeamRaleyghDampingBeta());
            }

            ChMatrixCorotation::ComputeCK(H_local, R, 4, CK);
            ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

            // For strict symmetry, copy L=U because the computations above might
            // lead to small errors because of numerical roundoff even with force_symmetric_stiffness
            if (force_symmetric_stiffness) {
                for (int row = 0; row < CKCt.rows() - 1; ++row)
                    for (int col = row + 1; col < CKCt.cols(); ++col)
                        CKCt(row, col) = CKCt(col, row);
            }

            //// RADU
            //// Check if the above can be done with the one-liner:
            ////CKCt.triangularView<Eigen::Upper>() = CKCt.transpose();

            H.block(0, 0, 12, 12) = CKCt;

            // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping), 
            // if enabled in section material.
            // These matrices are not symmetric. Also note
            if (this->section->compute_inertia_damping_matrix || this->section->compute_inertia_stiffness_matrix) {
                ChMatrixNM<double, 6, 6> matr_loc;
                ChMatrixNM<double, 6, 6> KRi_loc;
                KRi_loc.setZero();
                // A lumped version of the inertial damping/stiffness matrix computation is used here, on a per-node basis:
                double node_multiplier_fact_R = 0.5 * length * Rfactor;
                double node_multiplier_fact_K = 0.5 * length * Kfactor;
                for (int i = 0; i < nodes.size(); ++i) {
                    int stride = i * 6;
                    if (this->section->compute_inertia_damping_matrix) {
                        this->section->ComputeInertiaDampingMatrix(matr_loc, nodes[i]->GetWvel_loc());
                        KRi_loc += matr_loc * node_multiplier_fact_R;
                    }
                    if (this->section->compute_inertia_stiffness_matrix) {
                        this->section->ComputeInertiaStiffnessMatrix(matr_loc, nodes[i]->GetWvel_loc(), nodes[i]->GetWacc_loc(), (nodes[i]->GetA().transpose()) * nodes[i]->GetPos_dtdt()); // assume x_dtdt in local frame!
                        KRi_loc += matr_loc * node_multiplier_fact_K;
                    }
                    // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
                    //H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) * (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by construction
                    H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
                    H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
                    // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) * (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by construction
                }
            }
        }

    } 
    else
		H.setZero();

    //
    // The M mass matrix of this element:  
    //

    if (Mfactor || (Rfactor && this->section->GetBeamRaleyghDampingAlpha()) ) {

        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        //
        // "lumped" M mass matrix
        //
        ChMatrixNM<double, 6, 6> sectional_mass;
        this->section->ComputeInertiaMatrix(sectional_mass);

        // Rayleigh damping (stiffness proportional part)  [Rm] = alpha*[M] , so H += km*[M]+rf*[Rm]  H += (km+rf*alpha)*[M]

        double node_multiplier_fact = 0.5 * length * (Mfactor + Rfactor * this->section->GetBeamRaleyghDampingAlpha());
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6;
            // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
            // hence it can be the simple (constant) expression
            //   Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
            // but the more general case needs the rotations, hence:
            Mloc.block<3, 3>(stride,   stride  ) += sectional_mass.block<3, 3>(0,0) * node_multiplier_fact;
            Mloc.block<3, 3>(stride+3, stride+3) += sectional_mass.block<3, 3>(3,3) * node_multiplier_fact;
            Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0,3) * node_multiplier_fact;
            Mloc.block<3, 3>(stride,   stride+3) += Mxw;
            Mloc.block<3, 3>(stride+3, stride)   += Mxw.transpose();
        }
        
        /* The following would be needed if consistent mass matrix is used, but...
        ChMatrix33<> Atoabs(this->q_element_abs_rot);
        ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        std::vector< ChMatrix33<>* > R;
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelA);
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelB);

        ChMatrixCorotation::ComputeCK(Mloc, R, 4, CK);
        ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

        H.block(0,0,12,12) += CKCt;
        */

        // ..rather do this because lumped mass matrix does not need rotation transf.
        H.block(0, 0, 12, 12) += Mloc;

        //// TODO better per-node lumping, or 4x4 consistent mass matrices, maybe with integration if not uniform
        // materials.
    }

}